

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall
ScriptTest::DoTest(ScriptTest *this,CScript *scriptPubKey,CScript *scriptSig,
                  CScriptWitness *scriptWitness,uint32_t flags,string *message,int scriptError,
                  CAmount nValue)

{
  long lVar1;
  bool bVar2;
  uint64_t uVar3;
  int iVar4;
  uint flags_00;
  undefined4 in_register_00000084;
  iterator pvVar5;
  string *psVar6;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  check_type cVar8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  assertion_result local_280;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 local_238 [16];
  undefined1 *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  undefined8 local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  CMutableTransaction tx2;
  CMutableTransaction tx;
  ScriptError err;
  string local_178;
  uint32_t combined_flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  undefined8 local_c0;
  CTransaction txCredit;
  
  pvVar5 = (iterator)CONCAT44(in_register_00000084,flags);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flags_00 = flags | 0x801;
  if ((flags >> 8 & 1) == 0) {
    flags_00 = flags;
  }
  psVar6 = message;
  BuildCreditingTransaction(&tx,scriptPubKey,(int)nValue);
  CTransaction::CTransaction(&txCredit,&tx);
  CMutableTransaction::~CMutableTransaction(&tx);
  BuildSpendingTransaction(&tx,scriptSig,scriptWitness,&txCredit);
  CMutableTransaction::CMutableTransaction(&tx2,&tx);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = (iterator)psVar6;
  msg.m_begin = pvVar5;
  file.m_end = (iterator)0x7f;
  file.m_begin = (iterator)&local_200;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_210,msg);
  local_238._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_238._8_8_ = &tx;
  local_228 = (undefined1 *)0x0;
  local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (txCredit.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start)->nValue;
  local_218 = 0;
  bVar2 = VerifyScript(scriptSig,scriptPubKey,scriptWitness,flags_00,
                       (BaseSignatureChecker *)local_238,&err);
  local_f8._M_dataplus._M_p._0_1_ = (scriptError == 0) == bVar2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity = 0;
  local_d8[8] = false;
  local_d8._0_8_ = &PTR__lazy_ostream_01139e30;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_240 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = &DAT_00000001;
  local_c0 = message;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f8,(lazy_ostream *)local_d8,1,1,WARN,_cVar8,
             (size_t)&local_248,0x7f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_f8.field_2._M_allocated_capacity);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x80;
  file_00.m_begin = (iterator)&local_258;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_268,
             msg_00);
  local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(err == scriptError);
  local_280.m_message.px = (element_type *)0x0;
  local_280.m_message.pn.pi_ = (sp_counted_base *)0x0;
  FormatScriptError_abi_cxx11_((string *)&combined_flags,err);
  std::operator+(&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &combined_flags," where ");
  FormatScriptError_abi_cxx11_(&local_178,scriptError);
  std::operator+(&local_118,&local_138,&local_178);
  std::operator+(&local_f8,&local_118," expected: ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 &local_f8,message);
  local_238._8_8_ = local_238._8_8_ & 0xffffffffffffff00;
  local_238._0_8_ = &PTR__lazy_ostream_01139e30;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_288 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = &DAT_00000001;
  local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_280,(lazy_ostream *)local_238,1,1,WARN,_cVar8,(size_t)&local_290,0x80);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&combined_flags);
  boost::detail::shared_count::~shared_count(&local_280.m_message.pn);
  iVar4 = 0x10;
  while (bVar2 = iVar4 != 0, iVar4 = iVar4 + -1, bVar2) {
    uVar3 = RandomMixin<FastRandomContext>::randbits
                      (&(this->super_BasicTestingSetup).m_rng.super_RandomMixin<FastRandomContext>,
                       0x10);
    combined_flags = ~(uint)uVar3 & flags_00;
    if (scriptError != 0) {
      combined_flags = flags_00 | (uint)uVar3;
    }
    if (((combined_flags & 0x801) != 0x800) &&
       (((byte)(combined_flags >> 8) & (combined_flags & 0x801) != 0x801) == 0)) {
      local_2a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_298 = "";
      local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_01.m_end = pvVar7;
      msg_01.m_begin = pvVar5;
      file_01.m_end = (iterator)0x89;
      file_01.m_begin = (iterator)&local_2a0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2b0,
                 msg_01);
      local_238._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
      local_238._8_8_ = &tx;
      local_228 = (undefined1 *)0x0;
      local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (txCredit.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start)->nValue;
      local_218 = 0;
      bVar2 = VerifyScript(scriptSig,scriptPubKey,scriptWitness,combined_flags,
                           (BaseSignatureChecker *)local_238,&err);
      local_138._M_dataplus._M_p._0_1_ = (scriptError == 0) == bVar2;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      tinyformat::format<unsigned_int>(&local_118," (with flags %x)",&combined_flags);
      std::operator+(&local_f8,message,&local_118);
      local_d8[8] = false;
      local_d8._0_8_ = &PTR__lazy_ostream_01139e30;
      local_c8 = boost::unit_test::lazy_ostream::inst;
      local_2c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_2b8 = "";
      pvVar5 = &DAT_00000001;
      pvVar7 = &DAT_00000001;
      local_c0 = &local_f8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_138,(lazy_ostream *)local_d8,1,1,WARN,_cVar8,
                 (size_t)&local_2c0,0x89);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_138.field_2._M_allocated_capacity);
    }
  }
  CMutableTransaction::~CMutableTransaction(&tx2);
  CMutableTransaction::~CMutableTransaction(&tx);
  CTransaction::~CTransaction(&txCredit);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DoTest(const CScript& scriptPubKey, const CScript& scriptSig, const CScriptWitness& scriptWitness, uint32_t flags, const std::string& message, int scriptError, CAmount nValue = 0)
{
    bool expect = (scriptError == SCRIPT_ERR_OK);
    if (flags & SCRIPT_VERIFY_CLEANSTACK) {
        flags |= SCRIPT_VERIFY_P2SH;
        flags |= SCRIPT_VERIFY_WITNESS;
    }
    ScriptError err;
    const CTransaction txCredit{BuildCreditingTransaction(scriptPubKey, nValue)};
    CMutableTransaction tx = BuildSpendingTransaction(scriptSig, scriptWitness, txCredit);
    CMutableTransaction tx2 = tx;
    BOOST_CHECK_MESSAGE(VerifyScript(scriptSig, scriptPubKey, &scriptWitness, flags, MutableTransactionSignatureChecker(&tx, 0, txCredit.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err) == expect, message);
    BOOST_CHECK_MESSAGE(err == scriptError, FormatScriptError(err) + " where " + FormatScriptError((ScriptError_t)scriptError) + " expected: " + message);

    // Verify that removing flags from a passing test or adding flags to a failing test does not change the result.
    for (int i = 0; i < 16; ++i) {
        uint32_t extra_flags(m_rng.randbits(16));
        uint32_t combined_flags{expect ? (flags & ~extra_flags) : (flags | extra_flags)};
        // Weed out some invalid flag combinations.
        if (combined_flags & SCRIPT_VERIFY_CLEANSTACK && ~combined_flags & (SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS)) continue;
        if (combined_flags & SCRIPT_VERIFY_WITNESS && ~combined_flags & SCRIPT_VERIFY_P2SH) continue;
        BOOST_CHECK_MESSAGE(VerifyScript(scriptSig, scriptPubKey, &scriptWitness, combined_flags, MutableTransactionSignatureChecker(&tx, 0, txCredit.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err) == expect, message + strprintf(" (with flags %x)", combined_flags));
    }
}